

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS
ref_recon_extrapolate_kexact(REF_GRID ref_grid,REF_DBL *recon,REF_BOOL *replace,REF_INT ldim)

{
  size_t __size;
  double dVar1;
  double dVar2;
  double dVar3;
  REF_NODE ref_node;
  REF_ADJ pRVar4;
  REF_ADJ_ITEM pRVar5;
  REF_CLOUD pRVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  REF_STATUS RVar10;
  uint uVar11;
  REF_CELL pRVar12;
  REF_DBL *a;
  REF_DBL *q;
  REF_DBL *pRVar13;
  ulong uVar14;
  REF_DBL *pRVar15;
  long lVar16;
  undefined8 uVar17;
  REF_DBL *pRVar18;
  long lVar19;
  ulong uVar20;
  REF_DBL *pRVar21;
  double *pdVar22;
  char *pcVar23;
  long lVar24;
  long lVar25;
  REF_LONG ref_private_status_reib_ai;
  REF_CLOUD *ref_cloud_ptr;
  bool bVar26;
  REF_CLOUD ref_cloud;
  REF_DBL geom [10];
  REF_STATUS local_484;
  REF_CLOUD *local_468;
  ulong local_440;
  REF_CLOUD local_430;
  ulong local_428;
  REF_GRID local_420;
  REF_DBL *local_418;
  long local_410;
  REF_DBL local_408;
  long local_400;
  double local_3f8 [10];
  REF_DBL local_3a8;
  REF_DBL local_3a0;
  REF_DBL local_398;
  REF_DBL local_390;
  double adStack_88 [9];
  REF_DBL local_40;
  
  ref_node = ref_grid->node;
  if (ref_grid->twod == 0) {
    pRVar12 = ref_grid->cell[8];
  }
  else {
    pRVar12 = ref_grid->cell[3];
  }
  uVar7 = ref_node_ghost_int(ref_node,replace,ldim);
  if (uVar7 == 0) {
    uVar7 = ref_node_ghost_dbl(ref_node,recon,ldim);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x4a4
             ,"ref_recon_extrapolate_kexact",(ulong)uVar7,"update ghosts");
      return uVar7;
    }
    if (0 < ldim) {
      local_428 = (ulong)(uint)ldim;
      local_440 = 0;
      local_484 = 0;
      local_420 = ref_grid;
      do {
        iVar8 = ref_node->max;
        if ((long)iVar8 < 0) {
          bVar26 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x4a7,"ref_recon_extrapolate_kexact");
          local_484 = 1;
        }
        else {
          __size = (long)iVar8 * 8;
          local_468 = (REF_CLOUD *)malloc(__size);
          if (local_468 == (REF_CLOUD *)0x0) {
            bVar26 = false;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x4a7,"ref_recon_extrapolate_kexact");
            local_484 = 2;
            local_468 = (REF_CLOUD *)0x0;
          }
          else {
            bVar26 = true;
            if (iVar8 != 0) {
              memset(local_468,0,__size);
            }
          }
        }
        if (!bVar26) {
          return local_484;
        }
        if (0 < ref_node->max) {
          lVar25 = 0;
          ref_cloud_ptr = local_468;
          do {
            if ((-1 < ref_node->global[lVar25]) &&
               (uVar7 = ref_cloud_create(ref_cloud_ptr,4), uVar7 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x4a9,"ref_recon_extrapolate_kexact",(ulong)uVar7,"cloud storage");
              return uVar7;
            }
            lVar25 = lVar25 + 1;
            ref_cloud_ptr = ref_cloud_ptr + 1;
          } while (lVar25 < ref_node->max);
        }
        if (0 < ref_node->max) {
          lVar25 = 0;
          do {
            if ((-1 < ref_node->global[lVar25]) && (ref_node->ref_mpi->id == ref_node->part[lVar25])
               ) {
              pRVar4 = pRVar12->ref_adj;
              iVar8 = -1;
              uVar20 = 0xffffffff;
              if (lVar25 < pRVar4->nnode) {
                uVar20 = (ulong)(uint)pRVar4->first[lVar25];
              }
              if ((int)uVar20 != -1) {
                iVar8 = pRVar4->item[(int)uVar20].ref;
              }
              while ((int)uVar20 != -1) {
                if (0 < pRVar12->node_per) {
                  lVar24 = 0;
                  do {
                    uVar7 = pRVar12->c2n[(long)pRVar12->size_per * (long)iVar8 + lVar24];
                    iVar9 = uVar7 * ldim + (int)local_440;
                    if (replace[iVar9] == 0) {
                      lVar19 = -1;
                      if (((-1 < (int)uVar7) && ((int)uVar7 < ref_node->max)) &&
                         (lVar19 = ref_node->global[uVar7], lVar19 < 0)) {
                        lVar19 = -1;
                      }
                      lVar16 = (long)(int)uVar7;
                      pRVar18 = ref_node->real;
                      local_3a8 = pRVar18[lVar16 * 0xf];
                      local_3a0 = pRVar18[lVar16 * 0xf + 1];
                      local_398 = pRVar18[lVar16 * 0xf + 2];
                      local_390 = recon[iVar9];
                      uVar7 = ref_cloud_store(local_468[lVar25],lVar19,&local_3a8);
                      if (uVar7 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                               ,0x48e,"ref_recon_local_immediate_replace_cloud",(ulong)uVar7,
                               "store cloud stencil");
                        goto LAB_001eb96e;
                      }
                    }
                    lVar24 = lVar24 + 1;
                  } while ((int)lVar24 < pRVar12->node_per);
                }
                pRVar5 = pRVar12->ref_adj->item;
                uVar20 = (ulong)pRVar5[(int)uVar20].next;
                if (uVar20 == 0xffffffffffffffff) {
                  iVar8 = -1;
                }
                else {
                  iVar8 = pRVar5[uVar20].ref;
                }
              }
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 < ref_node->max);
        }
        uVar7 = 0;
LAB_001eb96e:
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x4ad,"ref_recon_extrapolate_kexact",(ulong)uVar7,"fill");
          return uVar7;
        }
        uVar7 = ref_recon_ghost_cloud(local_468,ref_node);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x4ae,"ref_recon_extrapolate_kexact",(ulong)uVar7,"fill ghosts");
          return uVar7;
        }
        if (0 < ref_node->max) {
          lVar25 = 0;
          do {
            if (((-1 < ref_node->global[lVar25]) &&
                (ref_node->ref_mpi->id == ref_node->part[lVar25])) &&
               (local_400 = lVar25 * local_428 + local_440, replace[local_400] != 0)) {
              uVar7 = ref_cloud_deep_copy(&local_430,local_468[lVar25]);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x4b2,"ref_recon_extrapolate_kexact",(ulong)uVar7,"create ref_cloud");
                return uVar7;
              }
              local_410 = lVar25 * 0x78;
              uVar7 = 2;
              do {
                pRVar6 = local_430;
                uVar11 = local_430->n;
                uVar20 = (ulong)uVar11;
                if ((int)uVar11 < 10) goto LAB_001ebd4c;
                pRVar18 = ref_node->real;
                a = (REF_DBL *)malloc(uVar20 * 0x50);
                if (a == (REF_DBL *)0x0) {
                  uVar17 = 0x27a;
LAB_001ebd40:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,uVar17,"ref_recon_kexact_center");
LAB_001ebd4c:
                  iVar8 = 4;
                }
                else {
                  q = (REF_DBL *)malloc(uVar20 * 0x50);
                  if (q == (REF_DBL *)0x0) {
                    uVar17 = 0x27b;
                    goto LAB_001ebd40;
                  }
                  pRVar13 = (REF_DBL *)malloc(800);
                  if (pRVar13 == (REF_DBL *)0x0) {
                    uVar17 = 0x27c;
                    goto LAB_001ebd40;
                  }
                  pRVar15 = pRVar6->aux;
                  iVar8 = pRVar6->naux;
                  dVar1 = *(double *)((long)pRVar18 + local_410);
                  dVar2 = *(double *)((long)pRVar18 + local_410 + 8);
                  dVar3 = *(double *)((long)pRVar18 + local_410 + 0x10);
                  uVar14 = 0;
                  pRVar18 = a;
                  do {
                    lVar24 = uVar14 * (long)iVar8;
                    local_3f8[6] = pRVar15[lVar24] - dVar1;
                    local_3f8[7] = pRVar15[lVar24 + 1] - dVar2;
                    local_3f8[8] = pRVar15[lVar24 + 2] - dVar3;
                    local_3f8[0] = local_3f8[6] * 0.5 * local_3f8[6];
                    local_3f8[1] = local_3f8[6] * local_3f8[7];
                    local_3f8[2] = local_3f8[6] * local_3f8[8];
                    local_3f8[3] = local_3f8[7] * 0.5 * local_3f8[7];
                    local_3f8[4] = local_3f8[7] * local_3f8[8];
                    local_3f8[5] = local_3f8[8] * 0.5 * local_3f8[8];
                    local_3f8[9] = 1.0;
                    lVar24 = 0;
                    pRVar21 = pRVar18;
                    do {
                      *pRVar21 = local_3f8[lVar24];
                      lVar24 = lVar24 + 1;
                      pRVar21 = pRVar21 + uVar20;
                    } while (lVar24 != 10);
                    uVar14 = uVar14 + 1;
                    pRVar18 = pRVar18 + 1;
                  } while (uVar14 != uVar20);
                  if (uVar11 != (uint)uVar14) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x297,"ref_recon_kexact_center","A row miscount",uVar20,
                           uVar14 & 0xffffffff);
                    free(pRVar13);
                    free(q);
                    free(a);
                    goto LAB_001ebd4c;
                  }
                  RVar10 = ref_matrix_qr(uVar11,10,a,q,pRVar13);
                  local_418 = pRVar13;
                  if (RVar10 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x29c,"ref_recon_kexact_center");
                    free(pRVar13);
                    free(q);
                    free(a);
                    goto LAB_001ebd4c;
                  }
                  pRVar18 = &local_3a8;
                  memset(pRVar18,0,0x370);
                  pRVar13 = local_418;
                  lVar24 = 0;
                  pRVar15 = local_418;
                  do {
                    lVar19 = 0;
                    do {
                      *(double *)((long)pRVar18 + lVar19) =
                           *(double *)((long)pRVar15 + lVar19) + *(double *)((long)pRVar18 + lVar19)
                      ;
                      lVar19 = lVar19 + 0x50;
                    } while (lVar19 != 800);
                    lVar24 = lVar24 + 1;
                    pRVar18 = pRVar18 + 1;
                    pRVar15 = pRVar15 + 1;
                  } while (lVar24 != 10);
                  iVar8 = pRVar6->n;
                  if ((long)iVar8 < 1) {
                    uVar14 = 0;
                  }
                  else {
                    pRVar18 = pRVar6->aux;
                    iVar9 = pRVar6->naux;
                    uVar14 = 0;
                    pRVar15 = q;
                    do {
                      lVar24 = 0;
                      pdVar22 = pRVar15;
                      do {
                        adStack_88[lVar24] =
                             *pdVar22 * pRVar18[uVar14 * (long)iVar9 + 3] + adStack_88[lVar24];
                        lVar24 = lVar24 + 1;
                        pdVar22 = pdVar22 + uVar20;
                      } while (lVar24 != 10);
                      uVar14 = uVar14 + 1;
                      pRVar15 = pRVar15 + 1;
                    } while (uVar14 != (long)iVar8);
                  }
                  if (uVar11 == (uint)uVar14) {
                    RVar10 = ref_matrix_solve_ab(10,0xb,&local_3a8);
                    if (RVar10 != 0) {
                      free(pRVar13);
                      free(q);
                      free(a);
                      goto LAB_001ebd4c;
                    }
                    local_408 = local_40;
                    free(pRVar13);
                    free(q);
                    free(a);
                    iVar8 = 0;
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x2b4,"ref_recon_kexact_center","b row miscount",uVar20,
                           uVar14 & 0xffffffff);
                    free(pRVar13);
                    free(q);
                    free(a);
                    iVar8 = 1;
                  }
                }
                if (iVar8 == 0) {
                  recon[local_400] = local_408;
                  replace[local_400] = 0;
                }
                else {
                  uVar11 = ref_recon_grow_cloud_one_layer(local_430,local_468,ref_node);
                  if (uVar11 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x4bc,"ref_recon_extrapolate_kexact",(ulong)uVar11,"grow");
                    return uVar11;
                  }
                }
              } while ((iVar8 != 0) && (bVar26 = uVar7 < 8, uVar7 = uVar7 + 1, bVar26));
              uVar7 = ref_cloud_free(local_430);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x4bf,"ref_recon_extrapolate_kexact",(ulong)uVar7,"free ref_cloud");
                return uVar7;
              }
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 < ref_node->max);
        }
        if (0 < ref_node->max) {
          lVar25 = 0;
          do {
            if (-1 < ref_node->global[lVar25]) {
              ref_cloud_free(local_468[lVar25]);
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 < ref_node->max);
        }
        if (local_468 != (REF_CLOUD *)0x0) {
          free(local_468);
        }
        local_440 = local_440 + 1;
        ref_grid = local_420;
      } while (local_440 != local_428);
    }
    uVar7 = ref_node_ghost_int(ref_node,replace,ldim);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x4c9
             ,"ref_recon_extrapolate_kexact",(ulong)uVar7,"update ghosts");
      return uVar7;
    }
    uVar7 = ref_node_ghost_dbl(ref_node,recon,ldim);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x4ca
             ,"ref_recon_extrapolate_kexact",(ulong)uVar7,"update ghosts");
      return uVar7;
    }
    uVar7 = ref_recon_extrapolate_zeroth(ref_grid,recon,replace,ldim);
    if (uVar7 == 0) {
      return 0;
    }
    pcVar23 = "zero";
    uVar17 = 0x4cc;
  }
  else {
    pcVar23 = "update ghosts";
    uVar17 = 0x4a3;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar17,
         "ref_recon_extrapolate_kexact",(ulong)uVar7,pcVar23);
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_recon_extrapolate_kexact(REF_GRID ref_grid,
                                                REF_DBL *recon,
                                                REF_BOOL *replace,
                                                REF_INT ldim) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT i, node;
  REF_CLOUD *one_layer, ref_cloud;
  REF_DBL center;
  REF_STATUS status;
  REF_INT layer;
  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  RSS(ref_node_ghost_int(ref_node, replace, ldim), "update ghosts");
  RSS(ref_node_ghost_dbl(ref_node, recon, ldim), "update ghosts");

  for (i = 0; i < ldim; i++) {
    ref_malloc_init(one_layer, ref_node_max(ref_node), REF_CLOUD, NULL);
    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_cloud_create(&(one_layer[node]), 4), "cloud storage");
    }
    RSS(ref_recon_local_immediate_replace_cloud(one_layer, ref_node, ref_cell,
                                                recon, replace, ldim, i),
        "fill");
    RSS(ref_recon_ghost_cloud(one_layer, ref_node), "fill ghosts");
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_owned(ref_node, node) && replace[i + ldim * node]) {
        RSS(ref_cloud_deep_copy(&ref_cloud, one_layer[node]),
            "create ref_cloud");
        status = REF_INVALID;
        for (layer = 2; status != REF_SUCCESS && layer <= 8; layer++) {
          status = ref_recon_kexact_center(ref_node_xyz_ptr(ref_node, node),
                                           ref_cloud, &center);
          if (REF_SUCCESS == status) {
            recon[i + ldim * node] = center;
            replace[i + ldim * node] = REF_FALSE;
          } else {
            RSS(ref_recon_grow_cloud_one_layer(ref_cloud, one_layer, ref_node),
                "grow");
          }
        }
        RSS(ref_cloud_free(ref_cloud), "free ref_cloud");
      }
    }

    each_ref_node_valid_node(ref_node, node) {
      ref_cloud_free(one_layer[node]); /* no-op for null */
    }
    ref_free(one_layer);
  }

  RSS(ref_node_ghost_int(ref_node, replace, ldim), "update ghosts");
  RSS(ref_node_ghost_dbl(ref_node, recon, ldim), "update ghosts");

  RSS(ref_recon_extrapolate_zeroth(ref_grid, recon, replace, ldim), "zero");

  return REF_SUCCESS;
}